

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

uint obmc_check_better(MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,MV *best_mv,
                      SubpelMvLimits *mv_limits,SUBPEL_SEARCH_VAR_PARAMS *var_params,
                      MV_COST_PARAMS *mv_cost_params,uint *besterr,uint *sse1,int *distortion,
                      int *has_better_mv)

{
  MV_COST_TYPE MVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined8 in_RAX;
  uint uVar5;
  int iVar6;
  short sVar7;
  int iVar8;
  short sVar9;
  short sVar10;
  uint sse;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  iVar8 = (int)*this_mv >> 0x10;
  uVar5 = 0x7fffffff;
  if ((((mv_limits->col_min <= iVar8) && (iVar8 <= mv_limits->col_max)) &&
      (iVar8 = (int)(*this_mv).row, mv_limits->row_min <= iVar8)) && (iVar8 <= mv_limits->row_max))
  {
    iVar8 = upsampled_obmc_pref_error(xd,cm,this_mv,var_params,&local_34);
    MVar1 = mv_cost_params->mv_cost_type;
    iVar6 = 0;
    if (MVar1 != '\x04') {
      sVar2 = mv_cost_params->ref_mv->row;
      sVar3 = mv_cost_params->ref_mv->col;
      sVar7 = this_mv->row - sVar2;
      sVar9 = this_mv->col - sVar3;
      sVar4 = -sVar7;
      if (0 < sVar7) {
        sVar4 = sVar7;
      }
      sVar10 = -sVar9;
      if (0 < sVar9) {
        sVar10 = sVar9;
      }
      if (MVar1 == '\x03') {
        iVar6 = (int)sVar10 + (int)sVar4 >> 3;
      }
      else if (MVar1 == '\x01') {
        iVar6 = (int)sVar10 + (int)sVar4 >> 2;
      }
      else if (MVar1 == '\0') {
        iVar6 = (int)(((long)mv_cost_params->mvcost[1][sVar9] +
                       (long)mv_cost_params->mvcost[0][sVar7] +
                      (long)*(int *)((long)mv_cost_params->mvjcost +
                                    (ulong)((uint)(this_mv->col != sVar3) * 4 +
                                           (uint)(this_mv->row != sVar2) * 8))) *
                      (long)mv_cost_params->error_per_bit + 0x2000U >> 0xe);
      }
    }
    uVar5 = iVar6 + iVar8;
    if (uVar5 < *besterr) {
      *besterr = uVar5;
      *best_mv = *this_mv;
      *distortion = iVar8;
      *sse1 = local_34;
      *(byte *)has_better_mv = (byte)*has_better_mv | 1;
    }
  }
  return uVar5;
}

Assistant:

static inline unsigned int obmc_check_better(
    MACROBLOCKD *xd, const AV1_COMMON *cm, const MV *this_mv, MV *best_mv,
    const SubpelMvLimits *mv_limits, const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *besterr,
    unsigned int *sse1, int *distortion, int *has_better_mv) {
  unsigned int cost;
  if (av1_is_subpelmv_in_range(mv_limits, *this_mv)) {
    unsigned int sse;
    const int thismse =
        upsampled_obmc_pref_error(xd, cm, this_mv, var_params, &sse);
    cost = mv_err_cost_(this_mv, mv_cost_params);

    cost += thismse;

    if (cost < *besterr) {
      *besterr = cost;
      *best_mv = *this_mv;
      *distortion = thismse;
      *sse1 = sse;
      *has_better_mv |= 1;
    }
  } else {
    cost = INT_MAX;
  }
  return cost;
}